

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void TR_DecList(ast *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ast *node_00;
  ast *a;
  ast *paVar2;
  ast *node_01;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  uint uVar6;
  int size;
  string __str;
  uint local_154;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  ast *local_130;
  C_OP local_128;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  char local_e0 [16];
  int local_d0;
  InterCode local_c8;
  
  node_00 = child(node,3);
  __len = 1;
  a = child(node,1);
  paVar2 = child(a,3);
  local_154 = 0;
  node_01 = child(a,1);
  pcVar3 = TR_VarDec(node_01,(int *)&local_154);
  if (local_154 != 0) {
    local_f8._0_4_ = 1;
    std::__cxx11::string::string((string *)&local_f0,pcVar3,(allocator *)&local_128);
    local_d0 = -1;
    __val = -local_154;
    if (0 < (int)local_154) {
      __val = local_154;
    }
    if (9 < __val) {
      uVar5 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar4 = (uint)uVar5;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_0010be6e;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_0010be6e;
        }
        if (uVar4 < 10000) goto LAB_0010be6e;
        uVar5 = uVar5 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_0010be6e:
    uVar6 = local_154 >> 0x1f;
    local_150 = &local_140;
    local_130 = paVar2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_150,(char)__len - (char)((int)local_154 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_150->_M_local_buf + uVar6,__len,__val);
    paVar1 = &local_128.value.field_2;
    local_128.kind = 1;
    if (local_150 == &local_140) {
      local_128.value.field_2._8_8_ = local_140._8_8_;
      local_128.value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128.value._M_dataplus._M_p = (pointer)local_150;
    }
    local_128.value._M_string_length = local_148;
    local_148 = 0;
    local_140._M_local_buf[0] = '\0';
    local_128.active = -1;
    local_150 = &local_140;
    IrSim::icUnaryOp(&local_c8,&irSim,0xf,(C_OP *)local_f8,&local_128);
    IrSim::commitIc(&irSim,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.arg2.value._M_dataplus._M_p != &local_c8.arg2.value.field_2) {
      operator_delete(local_c8.arg2.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.arg1.value._M_dataplus._M_p != &local_c8.arg1.value.field_2) {
      operator_delete(local_c8.arg1.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.target.value._M_dataplus._M_p != &local_c8.target.value.field_2) {
      operator_delete(local_c8.target.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.value._M_dataplus._M_p);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    paVar2 = local_130;
    if (local_f0._M_p != local_e0) {
      operator_delete(local_f0._M_p);
    }
  }
  if (paVar2 != (ast *)0x0) {
    paVar2 = child(a,2);
    TR_ASSIGNOP(paVar2,&OP_NONE);
  }
  if (node_00 != (ast *)0x0) {
    TR_DecList(node_00);
  }
  return;
}

Assistant:

static void TR_DecList(ast *node) {
    ast *c3 = child(node, 3);
    TR_Dec(child(node, 1));
    if (c3) TR_DecList(c3);
}